

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  undefined8 uVar7;
  char *pcVar8;
  long *plVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  byte bVar11;
  size_type *psVar12;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  undefined7 in_register_00000011;
  pointer pMVar13;
  ulong uVar14;
  string *inexpr;
  string *__rhs;
  bool bVar15;
  byte bVar16;
  long lVar17;
  string expr;
  string output;
  string variable;
  GlobMessages globMessages;
  Glob g;
  bool local_171;
  string local_170;
  cmCommand *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128 [2];
  long local_118 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  string local_100;
  uint local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  GlobMessages local_b8;
  undefined8 local_98;
  ulong local_90;
  Glob local_88;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_150 = &this->super_cmCommand;
  local_108 = args;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmFileCommand.cxx"
                  ,0x37c,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  uVar14 = CONCAT71(in_register_00000011,recurse) & 0xffffffff;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  cmsys::Glob::Glob(&local_88);
  bVar16 = (byte)uVar14;
  local_88.Recurse = (bool)bVar16;
  PVar5 = cmMakefile::GetPolicyStatus(local_150->Makefile,CMP0009);
  if ((PVar5 < (REQUIRED_ALWAYS|WARN) & bVar16) != 0) {
    local_88.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar5 * '\b' & 0x3fU),0);
  }
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  __rhs = pbVar1 + 2;
  local_171 = __rhs == (local_108->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
  if (local_171) {
    bVar11 = 0;
    id = extraout_EDX;
  }
  else {
    bVar15 = true;
    local_98 = 0;
    local_dc = (uint)CONCAT71(in_register_00000011,recurse);
    local_90 = (ulong)PVar5;
    do {
      iVar6 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar6 == 0) {
        pbVar1 = __rhs + 1;
        if (pbVar1 != (local_108->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = cmSystemTools::IsOn((pbVar1->_M_dataplus)._M_p);
          if (bVar4) {
            local_88.ListDirs = true;
            local_88.RecurseListDirs = true;
          }
          else {
            bVar4 = cmSystemTools::IsOff((pbVar1->_M_dataplus)._M_p);
            if (!bVar4) {
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
              cmCommand::SetError(local_150,&local_170);
              goto LAB_003b175d;
            }
            local_88.ListDirs = false;
            local_88.RecurseListDirs = false;
          }
          __rhs = __rhs + 2;
          goto LAB_003b10f1;
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
        cmCommand::SetError(local_150,&local_170);
LAB_003b175d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003b1779;
      }
LAB_003b10f1:
      if ((char)uVar14 != '\0') {
        uVar7 = std::__cxx11::string::compare((char *)__rhs);
        if ((int)uVar7 == 0) {
          local_88.RecurseThroughSymlinks = true;
          __rhs = __rhs + 1;
          local_98 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          if (__rhs == (local_108->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS","");
            cmCommand::SetError(local_150,&local_170);
            goto LAB_003b175d;
          }
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar6 == 0) {
        if (__rhs + 1 ==
            (local_108->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"GLOB requires a directory after the RELATIVE tag","");
          cmCommand::SetError(local_150,&local_170);
        }
        else {
          cmsys::Glob::SetRelative(&local_88,__rhs[1]._M_dataplus._M_p);
          __rhs = __rhs + 2;
          if (__rhs != (local_108->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) goto LAB_003b1178;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"GLOB requires a glob expression after the directory","");
          cmCommand::SetError(local_150,&local_170);
        }
        goto LAB_003b175d;
      }
LAB_003b1178:
      local_b8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = cmsys::SystemTools::FileIsFullPath((__rhs->_M_dataplus)._M_p);
      if (bVar4) {
        cmsys::Glob::FindFiles(&local_88,__rhs,&local_b8);
      }
      else {
        pcVar8 = cmMakefile::GetCurrentSourceDirectory(local_150->Makefile);
        std::__cxx11::string::string((string *)&local_170,pcVar8,(allocator *)&local_148);
        inexpr = __rhs;
        if (local_170._M_string_length != 0) {
          std::operator+(&local_148,"/",__rhs);
          std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          inexpr = &local_170;
        }
        cmsys::Glob::FindFiles(&local_88,inexpr,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_b8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_b8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_003b1529:
        pvVar10 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
        bVar4 = true;
        if ((pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          lVar17 = 8;
          uVar14 = 0;
          do {
            if (!bVar15) {
              std::__cxx11::string::append((char *)local_128);
            }
            std::__cxx11::string::_M_append
                      ((char *)local_128,
                       *(ulong *)((long)(pvVar10->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar17 + -8));
            uVar14 = uVar14 + 1;
            lVar17 = lVar17 + 0x20;
            bVar15 = false;
          } while (uVar14 < (ulong)((long)(pvVar10->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar10->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5));
          uVar14 = (ulong)local_dc;
        }
      }
      else {
        bVar4 = false;
        pMVar13 = local_b8.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar3 = local_150->Makefile;
          if (pMVar13->type == cyclicRecursion) {
            std::operator+(&local_d8,"Cyclic recursion detected while globbing for \'",__rhs);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_148.field_2._M_allocated_capacity = *psVar12;
              local_148.field_2._8_8_ = plVar9[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_148,
                                        (ulong)(pMVar13->content)._M_dataplus._M_p);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_170.field_2._M_allocated_capacity = *psVar12;
              local_170.field_2._8_8_ = plVar9[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar12;
              local_170._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_170._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::operator+(&local_d8,"Error has occured while globbing for \'",__rhs);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_148.field_2._M_allocated_capacity = *psVar12;
              local_148.field_2._8_8_ = plVar9[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_148,
                                        (ulong)(pMVar13->content)._M_dataplus._M_p);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_170.field_2._M_allocated_capacity = *psVar12;
              local_170.field_2._8_8_ = plVar9[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar12;
              local_170._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_170._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_170,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            bVar4 = true;
          }
          pMVar13 = pMVar13 + 1;
        } while (pMVar13 !=
                 local_b8.
                 super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        uVar14 = (ulong)local_dc;
        if (!bVar4) goto LAB_003b1529;
        bVar4 = false;
      }
      bVar16 = (byte)uVar14;
      std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&local_b8);
      if (!bVar4) goto LAB_003b1779;
      __rhs = __rhs + 1;
      local_171 = __rhs == (local_108->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_171);
    PVar5 = (PolicyStatus)local_90;
    bVar11 = (byte)local_98;
    id = extraout_EDX_00;
  }
  if (((bVar16 != 0) && (PVar5 < NEW && (bVar11 & 1) == 0)) && (local_88.FollowedSymlinkCount != 0))
  {
    pcVar3 = local_150->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_170,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  cmMakefile::AddDefinition(local_150->Makefile,&local_100,(char *)local_128[0]);
LAB_003b1779:
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return local_171;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
  bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if(recurse)
    {
    switch(status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
      }
    }

  std::string output = "";
  bool first = true;
  for ( ; i != args.end(); ++i )
    {
    if( *i == "LIST_DIRECTORIES" )
      {
      ++i;
      if(i != args.end())
        {
        if(cmSystemTools::IsOn(i->c_str()))
          {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
          }
        else if(cmSystemTools::IsOff(i->c_str()))
          {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
          }
        else
          {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
          }
        }
      else
        {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
        }
      ++i;
      }

    if ( recurse && (*i == "FOLLOW_SYMLINKS") )
      {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if ( i == args.end() )
        {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
        }
      }

    if ( *i == "RELATIVE" )
      {
      ++i; // skip RELATIVE
      if ( i == args.end() )
        {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
        }
      g.SetRelative(i->c_str());
      ++i;
      if(i == args.end())
        {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
        }
      }

    cmsys::Glob::GlobMessages globMessages;
    if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
      {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty())
        {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
        }
      else
        {
        g.FindFiles(*i, &globMessages);
        }
      }
    else
      {
      g.FindFiles(*i, &globMessages);
      }

    if(!globMessages.empty())
      {
      bool shouldExit = false;
      for(cmsys::Glob::GlobMessagesIterator it=globMessages.begin();
        it != globMessages.end(); ++it)
        {
        if(it->type == cmsys::Glob::cyclicRecursion)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '"
            + *i + "':\n" + it->content);
          }
        else
          {
          this->Makefile->IssueMessage(cmake::FATAL_ERROR,
            "Error has occured while globbing for '"
            + *i + "' - " + it->content);
          shouldExit = true;
          }
        }
      if(shouldExit)
        {
          return false;
        }
      }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    for ( cc = 0; cc < files.size(); cc ++ )
      {
      if ( !first )
        {
        output += ";";
        }
      output += files[cc];
      first = false;
      }
    }

  if(recurse && !explicitFollowSymlinks)
    {
    switch (status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
        // Probably not really the expected behavior, but the author explicitly
        // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if(g.GetFollowedSymlinkCount() != 0)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
          }
        break;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}